

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O2

unique_ptr<dap::Session,_std::default_delete<dap::Session>_> dap::Session::create(void)

{
  undefined8 *__s;
  __uniq_ptr_data<dap::Session,_std::default_delete<dap::Session>,_true,_true> in_RDI;
  
  __s = (undefined8 *)operator_new(0x350);
  memset(__s,0,0x350);
  *__s = &PTR__Impl_00abd0a0;
  *(undefined1 *)((long)__s + 9) = 0;
  ContentReader::ContentReader((ContentReader *)(__s + 2));
  __s[0x1e] = 0;
  __s[0x1f] = 0;
  __s[0x1c] = 0;
  __s[0x1d] = 0;
  __s[0x1a] = 0;
  __s[0x1b] = 0;
  __s[0x18] = 0;
  __s[0x19] = 0;
  __s[0x16] = 0;
  __s[0x17] = 0;
  __s[0x14] = 0;
  __s[0x15] = 0;
  __s[0x12] = 0;
  __s[0x13] = 0;
  __s[0xf] = 0;
  __s[0x10] = 0;
  *(undefined1 *)(__s + 0x11) = 0;
  __s[0x20] = __s + 0x26;
  __s[0x21] = 1;
  __s[0x22] = 0;
  __s[0x23] = 0;
  *(undefined4 *)(__s + 0x24) = 0x3f800000;
  __s[0x25] = 0;
  __s[0x26] = 0;
  __s[0x27] = 0;
  __s[0x28] = 0;
  __s[0x29] = 0;
  __s[0x2a] = 0;
  __s[0x2b] = 0;
  __s[0x2c] = __s + 0x32;
  __s[0x2d] = 1;
  __s[0x2e] = 0;
  __s[0x2f] = 0;
  *(undefined4 *)(__s + 0x30) = 0x3f800000;
  __s[0x31] = 0;
  __s[0x32] = 0;
  __s[0x37] = 0;
  __s[0x33] = 0;
  __s[0x34] = 0;
  __s[0x35] = 0;
  __s[0x36] = 0;
  __s[0x38] = __s + 0x3e;
  __s[0x39] = 1;
  __s[0x3a] = 0;
  __s[0x3b] = 0;
  *(undefined4 *)(__s + 0x3c) = 0x3f800000;
  __s[0x3d] = 0;
  __s[0x3e] = 0;
  __s[0x3f] = 0;
  __s[0x40] = 0;
  __s[0x43] = 0;
  __s[0x41] = 0;
  __s[0x42] = 0;
  __s[0x44] = __s + 0x4a;
  __s[0x45] = 1;
  __s[0x46] = 0;
  __s[0x47] = 0;
  *(undefined4 *)(__s + 0x48) = 0x3f800000;
  __s[0x4b] = 0;
  __s[0x4c] = 0;
  __s[0x49] = 0;
  __s[0x4a] = 0;
  Chan<std::function<void_()>_>::Chan((Chan<std::function<void_()>_> *)(__s + 0x4d));
  *(undefined4 *)(__s + 99) = 1;
  __s[100] = 0;
  __s[0x65] = 0;
  __s[0x66] = 0;
  __s[0x67] = 0;
  *(undefined8 *)((long)__s + 0x33c) = 0;
  *(undefined8 *)((long)__s + 0x344) = 0;
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
   super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
   super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl = __s;
  return (__uniq_ptr_data<dap::Session,_std::default_delete<dap::Session>,_true,_true>)
         (tuple<dap::Session_*,_std::default_delete<dap::Session>_>)
         in_RDI.super___uniq_ptr_impl<dap::Session,_std::default_delete<dap::Session>_>._M_t.
         super__Tuple_impl<0UL,_dap::Session_*,_std::default_delete<dap::Session>_>.
         super__Head_base<0UL,_dap::Session_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Session> Session::create() {
  return std::unique_ptr<Session>(new Impl());
}